

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashlist.c
# Opt level: O0

ktx_error_code_e ktxHashList_FindValue(ktxHashList *pHead,char *key,uint *pValueLen,void **ppValue)

{
  void **in_RCX;
  uint *in_RDX;
  ktx_error_code_e result;
  ktxHashListEntry *pEntry;
  ktxHashListEntry *local_30;
  ktx_error_code_e local_4;
  
  if ((in_RDX == (uint *)0x0) || (in_RCX == (void **)0x0)) {
    local_4 = KTX_INVALID_VALUE;
  }
  else {
    local_4 = ktxHashList_FindEntry
                        ((ktxHashList *)pValueLen,(char *)ppValue,(ktxHashListEntry **)pEntry);
    if (local_4 == KTX_SUCCESS) {
      ktxHashListEntry_GetValue(local_30,in_RDX,in_RCX);
      local_4 = KTX_SUCCESS;
    }
  }
  return local_4;
}

Assistant:

KTX_error_code
ktxHashList_FindValue(ktxHashList *pHead, const char* key, unsigned int* pValueLen, void** ppValue)
{
    if (pValueLen && ppValue) {
        ktxHashListEntry* pEntry;
        KTX_error_code result;

        result = ktxHashList_FindEntry(pHead, key, &pEntry);
        if (result == KTX_SUCCESS) {
            ktxHashListEntry_GetValue(pEntry, pValueLen, ppValue);
            return KTX_SUCCESS;
        } else
            return result;
    } else
        return KTX_INVALID_VALUE;
}